

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O1

string * __thiscall
wasm::Pass::getArgumentOrDefault
          (string *__return_storage_ptr__,Pass *this,string *key,string *defaultValue)

{
  size_t __n;
  PassRunner *pPVar1;
  pointer pcVar2;
  int iVar3;
  string local_70;
  string local_50;
  
  __n = key->_M_string_length;
  if (__n == (this->name)._M_string_length) {
    if (__n != 0) {
      iVar3 = bcmp((key->_M_dataplus)._M_p,(this->name)._M_dataplus._M_p,__n);
      if (iVar3 != 0) goto LAB_00798326;
    }
    std::optional<std::__cxx11::string>::value_or<std::__cxx11::string_const&>
              (__return_storage_ptr__,(optional<std::__cxx11::string> *)&this->passArg,defaultValue)
    ;
  }
  else {
LAB_00798326:
    pPVar1 = this->runner;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar2 = (key->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar2,pcVar2 + __n);
    pcVar2 = (defaultValue->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + defaultValue->_M_string_length);
    PassOptions::getArgumentOrDefault(__return_storage_ptr__,&pPVar1->options,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Pass::getArgumentOrDefault(const std::string& key,
                                       const std::string& defaultValue) {
  if (key == name) {
    return passArg.value_or(defaultValue);
  }

  return getPassOptions().getArgumentOrDefault(key, defaultValue);
}